

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

void write_setting_fontspec(settings_w *handle,char *name,FontSpec *fs)

{
  char *key;
  
  key = dupcat_fn(name,"Name",0);
  write_setting_s(handle,key,fs->name);
  safefree(key);
  return;
}

Assistant:

void write_setting_fontspec(settings_w *handle, const char *name, FontSpec *fs)
{
    /*
     * read_setting_fontspec had to handle two cases, but when
     * writing our settings back out we simply always generate the
     * new-style name.
     */
    char *suffname = dupcat(name, "Name");
    write_setting_s(handle, suffname, fs->name);
    sfree(suffname);
}